

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O1

int run_test_connection_fail_doesnt_auto_close(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *puVar2;
  int64_t eval_b;
  int64_t eval_a;
  long local_18;
  long local_10;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&timer);
  local_10 = (long)iVar1;
  local_18 = 0;
  if (local_10 == 0) {
    connection_fail(on_connect_without_close);
    local_10 = 1;
    local_18 = (long)timer_close_cb_calls;
    if (local_18 != 1) goto LAB_00180cf4;
    local_10 = 1;
    local_18 = (long)timer_cb_calls;
    if (local_18 == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      local_10 = 0;
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      local_18 = (long)iVar1;
      if (local_10 == local_18) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_00180d0e;
    }
  }
  else {
    run_test_connection_fail_doesnt_auto_close_cold_1();
LAB_00180cf4:
    run_test_connection_fail_doesnt_auto_close_cold_2();
  }
  run_test_connection_fail_doesnt_auto_close_cold_3();
LAB_00180d0e:
  iVar1 = (int)&local_18;
  run_test_connection_fail_doesnt_auto_close_cold_4();
  if (iVar1 == -0x6f) {
    connect_cb_calls = connect_cb_calls + 1;
    uv_timer_start(&timer,timer_cb,100,0);
    if (close_cb_calls == 0) {
      return 0;
    }
  }
  else {
    on_connect_without_close_cold_1();
  }
  on_connect_without_close_cold_2();
  close_cb_calls = close_cb_calls + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(connection_fail_doesnt_auto_close) {
/* TODO(gengjiawen): Fix test on QEMU. */
#if defined(__QEMU__)
  RETURN_SKIP("Test does not currently work in QEMU");
#endif

  int r;

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT_OK(r);

  connection_fail(on_connect_without_close);

  ASSERT_EQ(1, timer_close_cb_calls);
  ASSERT_EQ(1, timer_cb_calls);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}